

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm3_test.c
# Opt level: O1

int sm3_test_case(void)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char **ppcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint8_t h2 [32];
  uint8_t h1 [32];
  char local_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  char cStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  char cStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  char cStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  ppcVar4 = &sm3_test_vec[0].hash;
  uVar3 = 0;
  bVar5 = false;
  do {
    __s = ((SM3_TEST_VECTOR *)(ppcVar4 + -1))->in;
    pcVar1 = *ppcVar4;
    sVar2 = strlen(__s);
    SM3_once(__s,sVar2 & 0xffffffff,&local_58);
    hex_to_u8(pcVar1,0x40,&local_78);
    auVar7[0] = -(local_48 == local_68);
    auVar7[1] = -(cStack_47 == cStack_67);
    auVar7[2] = -(cStack_46 == cStack_66);
    auVar7[3] = -(cStack_45 == cStack_65);
    auVar7[4] = -(cStack_44 == cStack_64);
    auVar7[5] = -(cStack_43 == cStack_63);
    auVar7[6] = -(cStack_42 == cStack_62);
    auVar7[7] = -(cStack_41 == cStack_61);
    auVar7[8] = -(cStack_40 == cStack_60);
    auVar7[9] = -(cStack_3f == cStack_5f);
    auVar7[10] = -(cStack_3e == cStack_5e);
    auVar7[0xb] = -(cStack_3d == cStack_5d);
    auVar7[0xc] = -(cStack_3c == cStack_5c);
    auVar7[0xd] = -(cStack_3b == cStack_5b);
    auVar7[0xe] = -(cStack_3a == cStack_5a);
    auVar7[0xf] = -(cStack_39 == cStack_59);
    auVar6[0] = -(local_58 == local_78);
    auVar6[1] = -(cStack_57 == cStack_77);
    auVar6[2] = -(cStack_56 == cStack_76);
    auVar6[3] = -(cStack_55 == cStack_75);
    auVar6[4] = -(cStack_54 == cStack_74);
    auVar6[5] = -(cStack_53 == cStack_73);
    auVar6[6] = -(cStack_52 == cStack_72);
    auVar6[7] = -(cStack_51 == cStack_71);
    auVar6[8] = -(cStack_50 == cStack_70);
    auVar6[9] = -(cStack_4f == cStack_6f);
    auVar6[10] = -(cStack_4e == cStack_6e);
    auVar6[0xb] = -(cStack_4d == cStack_6d);
    auVar6[0xc] = -(cStack_4c == cStack_6c);
    auVar6[0xd] = -(cStack_4b == cStack_6b);
    auVar6[0xe] = -(cStack_4a == cStack_6a);
    auVar6[0xf] = -(cStack_49 == cStack_69);
    auVar6 = auVar6 & auVar7;
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) {
      printf("sm3 test case %d failed\n",(ulong)((int)uVar3 + 1));
      if (!bVar5) {
        return 0;
      }
      break;
    }
    bVar5 = 6 < uVar3;
    uVar3 = uVar3 + 1;
    ppcVar4 = ppcVar4 + 2;
  } while (uVar3 != 8);
  puts("sm3 test case PASS ");
  return 1;
}

Assistant:

int sm3_test_case()
{
    int ret = GML_ERROR;
    uint8_t h1[32];
    uint8_t h2[32];

    for (int i = 0; i < sizeof(sm3_test_vec) / sizeof(SM3_TEST_VECTOR); i++) {
        SM3_once((uint8_t*)sm3_test_vec[i].in, strlen(sm3_test_vec[i].in), h1);
        hex_to_u8((uint8_t*)sm3_test_vec[i].hash, 64, h2);
        if (memcmp(h1, h2, 32) != 0) {
            printf("sm3 test case %d failed\n", i+1);
            goto end;
        }
    }

    printf("sm3 test case PASS \n");
    ret = GML_OK;
end:
    return ret;
}